

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O2

void helics::detail::convertFromBinary
               (byte *data,vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val
               )

{
  pointer pcVar1;
  size_t __new_size;
  complex<double> *value;
  pointer data_00;
  
  __new_size = getDataSize(data);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(val,__new_size);
  if (__new_size != 0) {
    memcpy((val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start,data + 8,__new_size << 4);
  }
  if ((*data & 1) != 0) {
    pcVar1 = (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    for (data_00 = (val->
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
                   ._M_impl.super__Vector_impl_data._M_start; data_00 != pcVar1;
        data_00 = data_00 + 1) {
      checks::swapBytes<8ul>((byte *)data_00);
      checks::swapBytes<8ul>(data_00->_M_value + 8);
    }
  }
  return;
}

Assistant:

void convertFromBinary(const std::byte* data, std::vector<std::complex<double>>& val)
{
    const std::size_t size = getDataSize(data);
    val.resize(size);
    if (size > 0) {
        std::memcpy(reinterpret_cast<double*>(val.data()),
                    data + 8,
                    size * sizeof(std::complex<double>));
    }
    if ((data[0] & endianMask) != littleEndianCode) {
        for (auto& value : val) {
            // making use of array oriented access for complex numbers
            // See https://en.cppreference.com/w/cpp/numeric/complex
            checks::swapBytes<8>(reinterpret_cast<std::byte*>(&value));
            checks::swapBytes<8>(reinterpret_cast<std::byte*>(&value) + 8);
        }
    }
}